

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test<BinTrees::RBTree<int>>(void)

{
  RBTree<int> *this;
  ostream *poVar1;
  int *piVar2;
  void *pvVar3;
  RBTree<int> *t;
  int sum;
  undefined1 local_98 [56];
  int *in_stack_ffffffffffffffa0;
  initializer_list<int> in_stack_ffffffffffffffa8;
  
  memcpy(local_98,&DAT_0010729c,0x78);
  this = BinTrees::RBTree<int>::gen(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  poVar1 = std::operator<<((ostream *)&std::cout,"root:");
  piVar2 = BinTrees::BinTree<int>::V((BinTree<int> *)this);
  pvVar3 = (void *)std::ostream::operator<<(poVar1,*piVar2);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"result:");
  pvVar3 = (void *)std::ostream::operator<<(poVar1,0);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  if (this != (RBTree<int> *)0x0) {
    BinTrees::RBTree<int>::~RBTree((RBTree<int> *)0x102b5e);
    operator_delete(this,0x28);
  }
  return;
}

Assistant:

void test() {
    int sum = 0;
    auto *t = T::gen({3566, 2472, 1180, 2948, 2286, 4414, 1207, 2110, 1951, 4271,
                      1690, 3574, 4297, 4232, 2609, 1367, 3893, 1693, 1997, 1589,
                      3140, 2063, 2359, 3291, 2699, 4179, 2333, 3786, 1458, 3427}, sum);

    cout << "root:" << t->V() << endl << "result:" << sum << endl;

    delete t;
}